

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenDefaultValueBasic_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,FieldDef *field,
          bool enableLangOverrides)

{
  BaseType BVar1;
  bool bVar2;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator<char> local_31;
  Value *local_30;
  Value *value;
  FieldDef *pFStack_20;
  bool enableLangOverrides_local;
  FieldDef *field_local;
  CSharpGenerator *this_local;
  
  local_30 = &field->value;
  value._7_1_ = enableLangOverrides;
  pFStack_20 = field;
  field_local = (FieldDef *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  bVar2 = IsScalar((local_30->type).base_type);
  if (bVar2) {
    GenDefaultValue_abi_cxx11_(__return_storage_ptr__,this,pFStack_20,(bool)(value._7_1_ & 1));
    return __return_storage_ptr__;
  }
  if ((value._7_1_ & 1) != 0) {
    BVar1 = (local_30->type).base_type;
    if (BVar1 == BASE_TYPE_STRING) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"default(StringOffset)",&local_31);
      std::allocator<char>::~allocator(&local_31);
      return __return_storage_ptr__;
    }
    if (BVar1 == BASE_TYPE_VECTOR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"default(VectorOffset)",&local_89);
      std::allocator<char>::~allocator(&local_89);
      return __return_storage_ptr__;
    }
    if (BVar1 == BASE_TYPE_STRUCT) {
      NamespacedName_abi_cxx11_(&local_88,this,&((local_30->type).struct_def)->super_Definition);
      std::operator+(&local_68,"default(Offset<",&local_88);
      std::operator+(__return_storage_ptr__,&local_68,">)");
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"0",&local_8a)
  ;
  std::allocator<char>::~allocator(&local_8a);
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValueBasic(const FieldDef &field,
                                   bool enableLangOverrides) const {
    auto &value = field.value;
    if (!IsScalar(value.type.base_type)) {
      if (enableLangOverrides) {
        switch (value.type.base_type) {
          case BASE_TYPE_STRING: return "default(StringOffset)";
          case BASE_TYPE_STRUCT:
            return "default(Offset<" + NamespacedName(*value.type.struct_def) +
                   ">)";
          case BASE_TYPE_VECTOR: return "default(VectorOffset)";
          default: break;
        }
      }
      return "0";
    }
    return GenDefaultValue(field, enableLangOverrides);
  }